

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall CMU462::Matrix4x4::inv(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int i;
  long lVar17;
  double *pdVar18;
  long lVar19;
  Matrix4x4 *A;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  dVar1 = this->entries[2].y;
  dVar2 = this->entries[3].z;
  dVar3 = this->entries[1].w;
  dVar4 = this->entries[3].y;
  dVar5 = this->entries[2].z;
  dVar6 = this->entries[1].y;
  dVar7 = this->entries[1].z;
  dVar8 = this->entries[2].w;
  dVar9 = this->entries[3].w;
  __return_storage_ptr__->entries[0].x =
       dVar5 * dVar6 * dVar9 +
       (((dVar4 * dVar7 * dVar8 + (dVar1 * dVar2 * dVar3 - dVar3 * dVar4 * dVar5)) -
        dVar2 * dVar6 * dVar8) - dVar1 * dVar7 * dVar9);
  dVar10 = this->entries[3].x;
  dVar11 = this->entries[2].x;
  dVar12 = this->entries[1].x;
  __return_storage_ptr__->entries[1].x =
       (dVar7 * dVar11 * dVar9 +
       dVar2 * dVar12 * dVar8 +
       ((dVar5 * dVar10 * dVar3 - dVar3 * dVar2 * dVar11) - dVar7 * dVar10 * dVar8)) -
       dVar5 * dVar12 * dVar9;
  dVar23 = -dVar10;
  dVar21 = -dVar12;
  dVar20 = -dVar11;
  __return_storage_ptr__->entries[2].x =
       dVar1 * dVar12 * dVar9 +
       dVar6 * dVar20 * dVar9 +
       dVar4 * dVar21 * dVar8 +
       dVar6 * dVar10 * dVar8 + dVar4 * dVar11 * dVar3 + dVar3 * dVar1 * dVar23;
  __return_storage_ptr__->entries[3].x =
       dVar1 * dVar21 * dVar2 +
       dVar6 * dVar11 * dVar2 +
       dVar4 * dVar12 * dVar5 +
       dVar6 * dVar23 * dVar5 + dVar1 * dVar10 * dVar7 + dVar7 * dVar4 * dVar20;
  dVar13 = this->entries[0].w;
  dVar14 = this->entries[0].z;
  dVar15 = this->entries[0].y;
  __return_storage_ptr__->entries[0].y =
       (dVar1 * dVar14 * dVar9 +
       dVar2 * dVar15 * dVar8 +
       ((dVar4 * dVar5 * dVar13 - dVar1 * dVar2 * dVar13) - dVar4 * dVar14 * dVar8)) -
       dVar5 * dVar15 * dVar9;
  dVar16 = this->entries[0].x;
  __return_storage_ptr__->entries[1].y =
       dVar5 * dVar16 * dVar9 +
       (((dVar10 * dVar14 * dVar8 + (dVar2 * dVar11 * dVar13 - dVar5 * dVar10 * dVar13)) -
        dVar2 * dVar16 * dVar8) - dVar11 * dVar14 * dVar9);
  dVar22 = -dVar16;
  __return_storage_ptr__->entries[2].y =
       dVar1 * dVar22 * dVar9 +
       dVar11 * dVar15 * dVar9 +
       dVar4 * dVar16 * dVar8 +
       dVar23 * dVar15 * dVar8 + dVar1 * dVar10 * dVar13 + dVar4 * dVar20 * dVar13;
  __return_storage_ptr__->entries[3].y =
       dVar1 * dVar16 * dVar2 +
       dVar20 * dVar15 * dVar2 +
       dVar4 * dVar22 * dVar5 +
       dVar10 * dVar15 * dVar5 + dVar4 * dVar11 * dVar14 + dVar1 * dVar23 * dVar14;
  __return_storage_ptr__->entries[0].z =
       dVar7 * dVar15 * dVar9 +
       (((dVar4 * dVar14 * dVar3 + (dVar2 * dVar6 * dVar13 - dVar4 * dVar7 * dVar13)) -
        dVar2 * dVar15 * dVar3) - dVar6 * dVar14 * dVar9);
  __return_storage_ptr__->entries[1].z =
       (dVar12 * dVar14 * dVar9 +
       dVar2 * dVar16 * dVar3 +
       ((dVar7 * dVar10 * dVar13 - dVar2 * dVar12 * dVar13) - dVar10 * dVar14 * dVar3)) -
       dVar7 * dVar16 * dVar9;
  __return_storage_ptr__->entries[2].z =
       dVar9 * dVar16 * dVar6 +
       dVar21 * dVar15 * dVar9 +
       dVar4 * dVar22 * dVar3 +
       dVar10 * dVar15 * dVar3 + dVar4 * dVar12 * dVar13 + dVar6 * dVar23 * dVar13;
  __return_storage_ptr__->entries[3].z =
       dVar2 * dVar22 * dVar6 +
       dVar12 * dVar15 * dVar2 +
       dVar4 * dVar16 * dVar7 +
       dVar23 * dVar15 * dVar7 + dVar6 * dVar10 * dVar14 + dVar4 * dVar21 * dVar14;
  __return_storage_ptr__->entries[0].w =
       (dVar6 * dVar14 * dVar8 +
       dVar5 * dVar15 * dVar3 +
       ((dVar1 * dVar7 * dVar13 - dVar5 * dVar6 * dVar13) - dVar1 * dVar14 * dVar3)) -
       dVar7 * dVar15 * dVar8;
  __return_storage_ptr__->entries[1].w =
       dVar7 * dVar16 * dVar8 +
       (((dVar11 * dVar14 * dVar3 + (dVar5 * dVar12 * dVar13 - dVar7 * dVar11 * dVar13)) -
        dVar5 * dVar16 * dVar3) - dVar12 * dVar14 * dVar8);
  __return_storage_ptr__->entries[2].w =
       dVar22 * dVar6 * dVar8 +
       dVar12 * dVar15 * dVar8 +
       dVar1 * dVar16 * dVar3 +
       dVar20 * dVar15 * dVar3 + dVar6 * dVar11 * dVar13 + dVar1 * dVar21 * dVar13;
  __return_storage_ptr__->entries[3].w =
       dVar16 * dVar6 * dVar5 +
       dVar21 * dVar15 * dVar5 +
       dVar1 * dVar22 * dVar7 +
       dVar11 * dVar15 * dVar7 + dVar1 * dVar12 * dVar14 + dVar6 * dVar20 * dVar14;
  dVar1 = det(this);
  lVar17 = 0;
  pdVar18 = (double *)__return_storage_ptr__;
  do {
    lVar19 = 0;
    do {
      *(double *)((long)pdVar18 + lVar19) = *(double *)((long)pdVar18 + lVar19) * (1.0 / dVar1);
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x80);
    lVar17 = lVar17 + 1;
    pdVar18 = pdVar18 + 1;
  } while (lVar17 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::inv( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

	// Hardcoded in Fully Symbolic computation.

	B(0,0) = A(1,2)*A(2,3)*A(3,1) - A(1,3)*A(2,2)*A(3,1) + A(1,3)*A(2,1)*A(3,2) - A(1,1)*A(2,3)*A(3,2) - A(1,2)*A(2,1)*A(3,3) + A(1,1)*A(2,2)*A(3,3);
	B(0,1) = A(0,3)*A(2,2)*A(3,1) - A(0,2)*A(2,3)*A(3,1) - A(0,3)*A(2,1)*A(3,2) + A(0,1)*A(2,3)*A(3,2) + A(0,2)*A(2,1)*A(3,3) - A(0,1)*A(2,2)*A(3,3);
	B(0,2) = A(0,2)*A(1,3)*A(3,1) - A(0,3)*A(1,2)*A(3,1) + A(0,3)*A(1,1)*A(3,2) - A(0,1)*A(1,3)*A(3,2) - A(0,2)*A(1,1)*A(3,3) + A(0,1)*A(1,2)*A(3,3);
	B(0,3) = A(0,3)*A(1,2)*A(2,1) - A(0,2)*A(1,3)*A(2,1) - A(0,3)*A(1,1)*A(2,2) + A(0,1)*A(1,3)*A(2,2) + A(0,2)*A(1,1)*A(2,3) - A(0,1)*A(1,2)*A(2,3);
	B(1,0) = A(1,3)*A(2,2)*A(3,0) - A(1,2)*A(2,3)*A(3,0) - A(1,3)*A(2,0)*A(3,2) + A(1,0)*A(2,3)*A(3,2) + A(1,2)*A(2,0)*A(3,3) - A(1,0)*A(2,2)*A(3,3);
	B(1,1) = A(0,2)*A(2,3)*A(3,0) - A(0,3)*A(2,2)*A(3,0) + A(0,3)*A(2,0)*A(3,2) - A(0,0)*A(2,3)*A(3,2) - A(0,2)*A(2,0)*A(3,3) + A(0,0)*A(2,2)*A(3,3);
	B(1,2) = A(0,3)*A(1,2)*A(3,0) - A(0,2)*A(1,3)*A(3,0) - A(0,3)*A(1,0)*A(3,2) + A(0,0)*A(1,3)*A(3,2) + A(0,2)*A(1,0)*A(3,3) - A(0,0)*A(1,2)*A(3,3);
	B(1,3) = A(0,2)*A(1,3)*A(2,0) - A(0,3)*A(1,2)*A(2,0) + A(0,3)*A(1,0)*A(2,2) - A(0,0)*A(1,3)*A(2,2) - A(0,2)*A(1,0)*A(2,3) + A(0,0)*A(1,2)*A(2,3);
	B(2,0) = A(1,1)*A(2,3)*A(3,0) - A(1,3)*A(2,1)*A(3,0) + A(1,3)*A(2,0)*A(3,1) - A(1,0)*A(2,3)*A(3,1) - A(1,1)*A(2,0)*A(3,3) + A(1,0)*A(2,1)*A(3,3);
	B(2,1) = A(0,3)*A(2,1)*A(3,0) - A(0,1)*A(2,3)*A(3,0) - A(0,3)*A(2,0)*A(3,1) + A(0,0)*A(2,3)*A(3,1) + A(0,1)*A(2,0)*A(3,3) - A(0,0)*A(2,1)*A(3,3);
	B(2,2) = A(0,1)*A(1,3)*A(3,0) - A(0,3)*A(1,1)*A(3,0) + A(0,3)*A(1,0)*A(3,1) - A(0,0)*A(1,3)*A(3,1) - A(0,1)*A(1,0)*A(3,3) + A(0,0)*A(1,1)*A(3,3);
	B(2,3) = A(0,3)*A(1,1)*A(2,0) - A(0,1)*A(1,3)*A(2,0) - A(0,3)*A(1,0)*A(2,1) + A(0,0)*A(1,3)*A(2,1) + A(0,1)*A(1,0)*A(2,3) - A(0,0)*A(1,1)*A(2,3);
	B(3,0) = A(1,2)*A(2,1)*A(3,0) - A(1,1)*A(2,2)*A(3,0) - A(1,2)*A(2,0)*A(3,1) + A(1,0)*A(2,2)*A(3,1) + A(1,1)*A(2,0)*A(3,2) - A(1,0)*A(2,1)*A(3,2);
	B(3,1) = A(0,1)*A(2,2)*A(3,0) - A(0,2)*A(2,1)*A(3,0) + A(0,2)*A(2,0)*A(3,1) - A(0,0)*A(2,2)*A(3,1) - A(0,1)*A(2,0)*A(3,2) + A(0,0)*A(2,1)*A(3,2);
	B(3,2) = A(0,2)*A(1,1)*A(3,0) - A(0,1)*A(1,2)*A(3,0) - A(0,2)*A(1,0)*A(3,1) + A(0,0)*A(1,2)*A(3,1) + A(0,1)*A(1,0)*A(3,2) - A(0,0)*A(1,1)*A(3,2);
	B(3,3) = A(0,1)*A(1,2)*A(2,0) - A(0,2)*A(1,1)*A(2,0) + A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) - A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2);

	// Invertable iff the determinant is not equal to zero.
    B /= det();

    return B;
  }